

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedReader.cpp
# Opt level: O0

bool ZXing::OneD::
     FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (PairMap *all,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               Pairs *stack)

{
  bool bVar1;
  const_iterator stack_00;
  pointer ppVar2;
  pointer pPVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_RDX;
  Pairs *in_RDI;
  const_iterator pend;
  const_iterator p;
  int n;
  vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *pairs;
  int N;
  const_iterator ppairs;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff58;
  Pairs *in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 uVar4;
  undefined1 uVar5;
  __normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
  local_58;
  int local_4c;
  vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *local_48;
  undefined4 local_3c;
  _Self local_38;
  PairMap *all_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_10;
  bool local_1;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff60,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff58._M_current);
  if (bVar1) {
    local_1 = ChecksumIsValid(in_stack_ffffffffffffff60);
  }
  else {
    end_00._M_current = (int *)in_RDI;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_10);
    stack_00 = std::
               map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
               ::find((map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                       *)in_stack_ffffffffffffff58._M_current,(key_type *)0x2964e4);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
         ::end((map<int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>_>
                *)in_stack_ffffffffffffff58._M_current);
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,&local_38);
    if (bVar1) {
      local_3c = 2;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>_>
                             *)0x296525);
      local_48 = &ppVar2->second;
      local_4c = 0;
      local_58._M_current =
           (Pair *)std::
                   vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
                   begin((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                          *)in_stack_ffffffffffffff58._M_current);
      std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::end
                ((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_> *)
                 in_stack_ffffffffffffff58._M_current);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
                            *)in_stack_ffffffffffffff60,
                           (__normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
                            *)in_stack_ffffffffffffff58._M_current);
        uVar5 = bVar1 && local_4c < 2;
        if (!bVar1 || local_4c >= 2) break;
        pPVar3 = __gnu_cxx::
                 __normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
                 ::operator->(&local_58);
        bVar1 = DataBar::Character::operator_cast_to_bool(&pPVar3->right);
        uVar4 = false;
        if (!bVar1) {
          std::next<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffff58,0x2965ca);
          uVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_ffffffffffffff60,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)in_stack_ffffffffffffff58._M_current);
        }
        if ((bool)uVar4 == false) {
          all_00 = (PairMap *)in_RCX._M_current;
          __gnu_cxx::
          __normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
          ::operator*(&local_58);
          in_stack_ffffffffffffff60 = (Pairs *)end_00._M_current;
          std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
          push_back(in_RDI,(value_type *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff68)));
          end_00._M_current = (int *)in_stack_ffffffffffffff60;
          std::next<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                    (in_RCX,0x29663f);
          bVar1 = FindValidSequence<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                            (all_00,in_RDX,end_00,(Pairs *)stack_00._M_node);
          if (bVar1) {
            return true;
          }
          std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>::
          pop_back((vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                    *)0x29668a);
          in_stack_ffffffffffffff58._M_current = in_RCX._M_current;
          in_RCX._M_current = (int *)all_00;
        }
        __gnu_cxx::
        __normal_iterator<const_ZXing::OneD::DataBar::Pair_*,_std::vector<ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>_>_>
        ::operator++(&local_58);
        local_4c = local_4c + 1;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool FindValidSequence(const PairMap& all, ITER begin, ITER end, Pairs& stack)
{
	if (begin == end)
		return ChecksumIsValid(stack);

	if (auto ppairs = all.find(*begin); ppairs != all.end()) {
		// only try the N most common pairs, this means the absolute maximum number of ChecksumIsValid() evaluations
		// is N^11 (11 is the maximum sequence length).
		constexpr int N = 2;
		// TODO c++20 ranges::views::take()
		auto& pairs = ppairs->second;
		int n = 0;
		for (auto p = pairs.begin(), pend = pairs.end(); p != pend && n < N; ++p, ++n) {
			// skip p if it is a half-pair but not the last one in the sequence
			if (!p->right && std::next(begin) != end)
				continue;
			// to lower the chance of a misread, one can require each pair to have been seen at least N times.
			// e.g: if (p.count < 2) break;
			stack.push_back(*p);
			if (FindValidSequence(all, std::next(begin), end, stack))
				return true;
			stack.pop_back();
		}
	}

	return false;
}